

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O3

bool __thiscall
Valve::changeSetting(Valve *this,double newSetting,bool makeChange,string *reason,ostream *msgLog)

{
  double dVar1;
  
  dVar1 = (this->super_Link).setting;
  if (newSetting != dVar1 && makeChange) {
    this->hasFixedStatus = false;
    (this->super_Link).status = 1;
    std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n    ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (msgLog,(reason->_M_dataplus)._M_p,reason->_M_string_length);
    (this->super_Link).setting = newSetting;
  }
  return (bool)(-(dVar1 != newSetting) & 1);
}

Assistant:

bool Valve::changeSetting(
        double newSetting, bool makeChange, const string reason, ostream& msgLog)
{
    if ( newSetting != setting )
    {
        if ( makeChange )
        {
            hasFixedStatus = false;
            status = Link::LINK_OPEN;
            msgLog << "\n    " << reason;
            setting = newSetting;
        }
        return true;
    }
    return false;
}